

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathErr(xmlXPathParserContextPtr ctxt,int error)

{
  xmlXPathContextPtr pxVar1;
  xmlStructuredErrorFunc UNRECOVERED_JUMPTABLE;
  xmlChar *pxVar2;
  int int1;
  xmlNodePtr nod;
  uint uVar3;
  char *pcVar4;
  
  uVar3 = 0x1b;
  if ((uint)error < 0x1b) {
    uVar3 = error;
  }
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    pcVar4 = xmlXPathErrorMessages[uVar3];
    int1 = 0;
    pxVar2 = (xmlChar *)0x0;
  }
  else {
    ctxt->error = uVar3;
    if (ctxt->context != (xmlXPathContextPtr)0x0) {
      xmlResetError(&ctxt->context->lastError);
      pxVar1 = ctxt->context;
      (pxVar1->lastError).domain = 0xc;
      (pxVar1->lastError).code = uVar3 + 0x4b0;
      (pxVar1->lastError).level = XML_ERR_ERROR;
      pxVar2 = xmlStrdup(ctxt->base);
      pxVar1 = ctxt->context;
      (pxVar1->lastError).str1 = (char *)pxVar2;
      pxVar2 = ctxt->base;
      int1 = *(int *)&ctxt->cur - (int)pxVar2;
      (pxVar1->lastError).int1 = int1;
      UNRECOVERED_JUMPTABLE = pxVar1->error;
      nod = pxVar1->debugNode;
      (pxVar1->lastError).node = nod;
      if (UNRECOVERED_JUMPTABLE != (xmlStructuredErrorFunc)0x0) {
        (*UNRECOVERED_JUMPTABLE)(pxVar1->userData,&pxVar1->lastError);
        return;
      }
      pcVar4 = xmlXPathErrorMessages[uVar3];
      goto LAB_001d4ef4;
    }
    pxVar2 = ctxt->base;
    int1 = *(int *)&ctxt->cur - (int)pxVar2;
    pcVar4 = xmlXPathErrorMessages[uVar3];
  }
  nod = (xmlNodePtr)0x0;
LAB_001d4ef4:
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,nod,
                  0xc,uVar3 + 0x4b0,XML_ERR_ERROR,(char *)0x0,0,(char *)pxVar2,(char *)0x0,
                  (char *)0x0,int1,0,"%s",pcVar4);
  return;
}

Assistant:

void
xmlXPathErr(xmlXPathParserContextPtr ctxt, int error)
{
    if ((error < 0) || (error > MAXERRNO))
	error = MAXERRNO;
    if (ctxt == NULL) {
	__xmlRaiseError(NULL, NULL, NULL,
			NULL, NULL, XML_FROM_XPATH,
			error + XML_XPATH_EXPRESSION_OK - XPATH_EXPRESSION_OK,
			XML_ERR_ERROR, NULL, 0,
			NULL, NULL, NULL, 0, 0,
			"%s", xmlXPathErrorMessages[error]);
	return;
    }
    ctxt->error = error;
    if (ctxt->context == NULL) {
	__xmlRaiseError(NULL, NULL, NULL,
			NULL, NULL, XML_FROM_XPATH,
			error + XML_XPATH_EXPRESSION_OK - XPATH_EXPRESSION_OK,
			XML_ERR_ERROR, NULL, 0,
			(const char *) ctxt->base, NULL, NULL,
			ctxt->cur - ctxt->base, 0,
			"%s", xmlXPathErrorMessages[error]);
	return;
    }

    /* cleanup current last error */
    xmlResetError(&ctxt->context->lastError);

    ctxt->context->lastError.domain = XML_FROM_XPATH;
    ctxt->context->lastError.code = error + XML_XPATH_EXPRESSION_OK -
                           XPATH_EXPRESSION_OK;
    ctxt->context->lastError.level = XML_ERR_ERROR;
    ctxt->context->lastError.str1 = (char *) xmlStrdup(ctxt->base);
    ctxt->context->lastError.int1 = ctxt->cur - ctxt->base;
    ctxt->context->lastError.node = ctxt->context->debugNode;
    if (ctxt->context->error != NULL) {
	ctxt->context->error(ctxt->context->userData,
	                     &ctxt->context->lastError);
    } else {
	__xmlRaiseError(NULL, NULL, NULL,
			NULL, ctxt->context->debugNode, XML_FROM_XPATH,
			error + XML_XPATH_EXPRESSION_OK - XPATH_EXPRESSION_OK,
			XML_ERR_ERROR, NULL, 0,
			(const char *) ctxt->base, NULL, NULL,
			ctxt->cur - ctxt->base, 0,
			"%s", xmlXPathErrorMessages[error]);
    }

}